

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O0

int worker_is_idle(worker_handle *wh)

{
  void *pvVar1;
  uint local_1c;
  int ret;
  worker_priv *priv;
  worker_handle *wh_local;
  
  pvVar1 = wh->priv;
  mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x10));
  local_1c = (uint)(4 < *(uint *)((long)pvVar1 + 0x38));
  mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x10));
  return local_1c;
}

Assistant:

int worker_is_idle(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;
	int ret = 0;

	mutex_lock_shared(&priv->mutex);

	if (priv->state >= WORKER_IDLE)
		ret = 1;

	mutex_unlock_shared(&priv->mutex);

	return ret;
}